

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

void __thiscall
libcellml::Annotator::AnnotatorImpl::setId(AnnotatorImpl *this,AnyCellmlElementPtr *item,string *id)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  CellmlElementType CVar2;
  element_type *this_00;
  element_type *peVar3;
  element_type *this_01;
  element_type *peVar4;
  Entity *this_02;
  element_type *peVar5;
  element_type *__s;
  element_type *this_03;
  char *index;
  element_type *peVar6;
  element_type *this_04;
  int __c;
  shared_ptr<libcellml::Variable> local_150;
  shared_ptr<libcellml::Units> local_140;
  shared_ptr<libcellml::Units> local_130;
  undefined1 local_120 [8];
  UnitsItemPtr unitsItem;
  shared_ptr<libcellml::Reset> local_100;
  shared_ptr<libcellml::Reset> local_f0;
  shared_ptr<libcellml::Model> local_e0;
  VariablePtr local_d0;
  VariablePtr local_c0;
  undefined1 local_b0 [8];
  VariablePairPtr variablePair_1;
  shared_ptr<libcellml::Model> local_90;
  VariablePtr local_80;
  VariablePtr local_70;
  undefined1 local_60 [8];
  VariablePairPtr variablePair;
  shared_ptr<libcellml::Component> local_30;
  string *local_20;
  string *id_local;
  AnyCellmlElementPtr *item_local;
  AnnotatorImpl *this_local;
  
  local_20 = id;
  id_local = (string *)item;
  item_local = (AnyCellmlElementPtr *)this;
  this_00 = std::
            __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)item);
  CVar2 = AnyCellmlElement::type(this_00);
  switch(CVar2) {
  case COMPONENT:
    std::__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)id_local);
    AnyCellmlElement::component((AnyCellmlElement *)&local_30);
    peVar3 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_30);
    Entity::setId((Entity *)peVar3,local_20);
    std::shared_ptr<libcellml::Component>::~shared_ptr(&local_30);
    break;
  case COMPONENT_REF:
    std::__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)id_local);
    p_Var1 = &variablePair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
    AnyCellmlElement::component((AnyCellmlElement *)p_Var1);
    peVar3 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)p_Var1);
    ComponentEntity::setEncapsulationId(&peVar3->super_ComponentEntity,local_20);
    std::shared_ptr<libcellml::Component>::~shared_ptr
              ((shared_ptr<libcellml::Component> *)
               &variablePair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    break;
  case CONNECTION:
    std::__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)id_local);
    AnyCellmlElement::variablePair((AnyCellmlElement *)local_60);
    std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_60);
    VariablePair::variable1((VariablePair *)&local_70);
    std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_60);
    VariablePair::variable2((VariablePair *)&local_80);
    Variable::setEquivalenceConnectionId(&local_70,&local_80,local_20);
    std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_80);
    std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_70);
    std::shared_ptr<libcellml::VariablePair>::~shared_ptr
              ((shared_ptr<libcellml::VariablePair> *)local_60);
    break;
  case ENCAPSULATION:
    std::__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)id_local);
    AnyCellmlElement::model((AnyCellmlElement *)&local_90);
    peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_90);
    ComponentEntity::setEncapsulationId(&peVar4->super_ComponentEntity,local_20);
    std::shared_ptr<libcellml::Model>::~shared_ptr(&local_90);
    break;
  case IMPORT:
    std::__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)id_local);
    p_Var1 = &variablePair_1.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount;
    AnyCellmlElement::importSource((AnyCellmlElement *)p_Var1);
    this_01 = std::
              __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)p_Var1);
    Entity::setId(&this_01->super_Entity,local_20);
    std::shared_ptr<libcellml::ImportSource>::~shared_ptr
              ((shared_ptr<libcellml::ImportSource> *)
               &variablePair_1.
                super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    break;
  case MAP_VARIABLES:
    std::__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)id_local);
    AnyCellmlElement::variablePair((AnyCellmlElement *)local_b0);
    std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_b0);
    VariablePair::variable1((VariablePair *)&local_c0);
    std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_b0);
    VariablePair::variable2((VariablePair *)&local_d0);
    Variable::setEquivalenceMappingId(&local_c0,&local_d0,local_20);
    std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_d0);
    std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_c0);
    std::shared_ptr<libcellml::VariablePair>::~shared_ptr
              ((shared_ptr<libcellml::VariablePair> *)local_b0);
    break;
  default:
    std::__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)id_local);
    AnyCellmlElement::variable((AnyCellmlElement *)&local_150);
    this_04 = std::
              __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&local_150);
    Entity::setId((Entity *)this_04,local_20);
    std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_150);
    break;
  case MODEL:
    std::__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)id_local);
    AnyCellmlElement::model((AnyCellmlElement *)&local_e0);
    peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_e0);
    Entity::setId((Entity *)peVar4,local_20);
    std::shared_ptr<libcellml::Model>::~shared_ptr(&local_e0);
    break;
  case RESET:
    std::__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)id_local);
    AnyCellmlElement::reset((AnyCellmlElement *)&local_f0);
    this_02 = (Entity *)
              std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&local_f0);
    Entity::setId(this_02,local_20);
    std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_f0);
    break;
  case RESET_VALUE:
    std::__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)id_local);
    AnyCellmlElement::reset((AnyCellmlElement *)&local_100);
    peVar5 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_100);
    Reset::setResetValueId(peVar5,local_20);
    std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_100);
    break;
  case TEST_VALUE:
    std::__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)id_local);
    p_Var1 = &unitsItem.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
    AnyCellmlElement::reset((AnyCellmlElement *)p_Var1);
    peVar5 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)p_Var1);
    Reset::setTestValueId(peVar5,local_20);
    std::shared_ptr<libcellml::Reset>::~shared_ptr
              ((shared_ptr<libcellml::Reset> *)
               &unitsItem.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    break;
  case UNIT:
    std::__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)id_local);
    AnyCellmlElement::unitsItem((AnyCellmlElement *)local_120);
    __s = std::__shared_ptr_access<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)local_120);
    UnitsItem::units((UnitsItem *)&local_130);
    peVar6 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_130);
    this_03 = std::
              __shared_ptr_access<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_120);
    index = UnitsItem::index(this_03,(char *)__s,__c);
    Units::setUnitId(peVar6,(size_t)index,local_20);
    std::shared_ptr<libcellml::Units>::~shared_ptr(&local_130);
    std::shared_ptr<libcellml::UnitsItem>::~shared_ptr
              ((shared_ptr<libcellml::UnitsItem> *)local_120);
    break;
  case UNITS:
    std::__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)id_local);
    AnyCellmlElement::units((AnyCellmlElement *)&local_140);
    peVar6 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_140);
    Entity::setId((Entity *)peVar6,local_20);
    std::shared_ptr<libcellml::Units>::~shared_ptr(&local_140);
  }
  return;
}

Assistant:

void Annotator::AnnotatorImpl::setId(const AnyCellmlElementPtr &item, const std::string &id)
{
    switch (item->type()) {
    case CellmlElementType::COMPONENT:
        item->component()->setId(id);
        break;
    case CellmlElementType::COMPONENT_REF:
        item->component()->setEncapsulationId(id);
        break;
    case CellmlElementType::CONNECTION: {
        auto variablePair = item->variablePair();
        Variable::setEquivalenceConnectionId(variablePair->variable1(), variablePair->variable2(), id);
    } break;
    case CellmlElementType::ENCAPSULATION:
        item->model()->setEncapsulationId(id);
        break;
    case CellmlElementType::IMPORT:
        item->importSource()->setId(id);
        break;
    case CellmlElementType::MAP_VARIABLES: {
        auto variablePair = item->variablePair();
        Variable::setEquivalenceMappingId(variablePair->variable1(), variablePair->variable2(), id);
    } break;
    case CellmlElementType::MODEL:
        item->model()->setId(id);
        break;
    case CellmlElementType::RESET:
        item->reset()->setId(id);
        break;
    case CellmlElementType::RESET_VALUE:
        item->reset()->setResetValueId(id);
        break;
    case CellmlElementType::TEST_VALUE:
        item->reset()->setTestValueId(id);
        break;
    case CellmlElementType::UNIT: {
        auto unitsItem = item->unitsItem();
        unitsItem->units()->setUnitId(unitsItem->index(), id);
    } break;
    case CellmlElementType::UNITS:
        item->units()->setId(id);
        break;
    default: /* CellmlElementType::VARIABLE */
        item->variable()->setId(id);
        break;
    }
}